

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDDir.cpp
# Opt level: O3

void __thiscall NaDataDirector::StartEpoch(NaDataDirector *this,NaDataDirIterKind ik)

{
  if (ik == ddikRandomized) {
    this->eIterKind = ddikRandomized;
    this->nIterDone = 0;
    this->iIndex = 0;
    if (this->nDataVolume != this->nFeedbackDepth) {
      memset(this->bUsed,0,(ulong)(this->nDataVolume + ~this->nFeedbackDepth) + 1);
      return;
    }
  }
  else if (ik == ddikSequence) {
    this->eIterKind = ddikSequence;
    this->nIterDone = 0;
    this->iIndex = 0;
    return;
  }
  return;
}

Assistant:

void        NaDataDirector::StartEpoch (NaDataDirIterKind ik)
{
    switch(ik){

    case ddikSequence:
        eIterKind = ik;
        iIndex = nIterDone = 0;
        break;

    case ddikRandomized:
        eIterKind = ik;
        iIndex = nIterDone = 0;
        for(unsigned i = 0; i < GetEpochLen(); ++i){
            bUsed[i] = false;
        }
        break;
    }
}